

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<unsigned_int>::pop_back(QList<unsigned_int> *this)

{
  removeLast(this);
  return;
}

Assistant:

void pop_back() noexcept { removeLast(); }